

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<float,_1000>::Resize(TPZManVector<float,_1000> *this,int64_t newsize,float *object)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  ostream *poVar4;
  float *pfVar5;
  ulong uVar6;
  int64_t i;
  long lVar7;
  double dVar8;
  
  if (-1 < newsize) {
    lVar7 = (this->super_TPZVec<float>).fNElements;
    if (lVar7 != newsize) {
      lVar3 = (this->super_TPZVec<float>).fNAlloc;
      if (lVar3 < newsize) {
        if ((ulong)newsize < 0x3e9) {
          pfVar5 = (this->super_TPZVec<float>).fStore;
          pfVar2 = this->fExtAlloc;
          lVar3 = 0;
          if (lVar7 < 1) {
            lVar7 = lVar3;
          }
          for (; lVar7 != lVar3; lVar3 = lVar3 + 1) {
            pfVar2[lVar3] = pfVar5[lVar3];
          }
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            pfVar2[lVar7] = *object;
          }
          if (pfVar5 != (float *)0x0 && pfVar5 != pfVar2) {
            operator_delete__(pfVar5);
          }
          (this->super_TPZVec<float>).fStore = pfVar2;
          (this->super_TPZVec<float>).fNElements = newsize;
          (this->super_TPZVec<float>).fNAlloc = 1000;
        }
        else {
          dVar8 = (double)lVar3 * 1.2;
          uVar6 = (long)dVar8;
          if (dVar8 < (double)newsize) {
            uVar6 = newsize;
          }
          lVar3 = 0;
          pfVar5 = (float *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
          pfVar2 = (this->super_TPZVec<float>).fStore;
          if (lVar7 < 1) {
            lVar7 = lVar3;
          }
          for (; lVar7 != lVar3; lVar3 = lVar3 + 1) {
            pfVar5[lVar3] = pfVar2[lVar3];
          }
          fVar1 = *object;
          for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
            pfVar5[lVar7] = fVar1;
          }
          if (pfVar2 != (float *)0x0 && pfVar2 != this->fExtAlloc) {
            operator_delete__(pfVar2);
          }
          (this->super_TPZVec<float>).fStore = pfVar5;
          (this->super_TPZVec<float>).fNElements = newsize;
          (this->super_TPZVec<float>).fNAlloc = uVar6;
        }
      }
      else {
        pfVar2 = (this->super_TPZVec<float>).fStore;
        for (; lVar7 < newsize; lVar7 = lVar7 + 1) {
          pfVar2[lVar7] = *object;
        }
        (this->super_TPZVec<float>).fNElements = newsize;
      }
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}